

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall ipx::Model::PrintCoefficientRange(Model *this,Control *control)

{
  bool bVar1;
  Int IVar2;
  double *pdVar3;
  double *pdVar4;
  ostream *poVar5;
  stringstream *logging;
  ostream *poVar6;
  int iVar7;
  long in_RDI;
  double x_4;
  double *__end1_3;
  double *__begin1_3;
  Vector *__range1_3;
  double x_3;
  double *__end1_2;
  double *__begin1_2;
  Vector *__range1_2;
  double boundmax;
  double boundmin;
  double x_2;
  double *__end1_1;
  double *__begin1_1;
  Vector *__range1_1;
  double objmax;
  double objmin;
  double x_1;
  double *__end1;
  double *__begin1;
  Vector *__range1;
  double rhsmax;
  double rhsmin;
  stringstream h_logging_stream;
  double x;
  Int p;
  Int j;
  double amax;
  double amin;
  valarray<double> *in_stack_fffffffffffffa28;
  SparseMatrix *in_stack_fffffffffffffa30;
  double in_stack_fffffffffffffa38;
  stringstream *in_stack_fffffffffffffb18;
  Control *in_stack_fffffffffffffb20;
  Control *this_00;
  string local_468 [32];
  string local_448 [16];
  char (*in_stack_fffffffffffffbc8) [17];
  string local_428 [32];
  double local_408;
  double local_400;
  double local_3f8;
  double *local_3f0;
  double *local_3e8;
  double *local_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  double *local_3c0;
  double *local_3b8;
  double *local_3b0;
  double local_3a8;
  double local_3a0;
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  double local_338;
  double local_330;
  double local_328;
  double *local_320;
  double *local_318;
  double *local_310;
  double local_308;
  double local_300;
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  double local_298;
  double local_290;
  double local_288;
  double *local_280;
  double *local_278;
  double *local_270;
  double local_268;
  double local_260;
  string local_258 [32];
  string local_238 [32];
  string local_218 [48];
  string local_1e8 [32];
  stringstream local_1c8 [16];
  undefined1 local_1b8 [384];
  double local_38;
  double local_30;
  int local_28;
  int local_24;
  double local_20;
  double local_18 [3];
  
  local_18[0] = INFINITY;
  local_20 = 0.0;
  for (local_24 = 0; iVar7 = local_24, IVar2 = SparseMatrix::cols((SparseMatrix *)0x8407e1),
      iVar7 < IVar2; local_24 = local_24 + 1) {
    for (local_28 = SparseMatrix::begin(in_stack_fffffffffffffa30,
                                        (Int)((ulong)in_stack_fffffffffffffa28 >> 0x20));
        iVar7 = local_28,
        IVar2 = SparseMatrix::end(in_stack_fffffffffffffa30,
                                  (Int)((ulong)in_stack_fffffffffffffa28 >> 0x20)), iVar7 < IVar2;
        local_28 = local_28 + 1) {
      iVar7 = (int)in_RDI + 0x208;
      local_30 = SparseMatrix::value(in_stack_fffffffffffffa30,
                                     (Int)((ulong)in_stack_fffffffffffffa28 >> 0x20));
      if ((local_30 != 0.0) || (NAN(local_30))) {
        std::abs(iVar7);
        pdVar4 = local_18;
        pdVar3 = std::min<double>(pdVar4,&local_38);
        local_18[0] = *pdVar3;
        std::abs((int)pdVar4);
        pdVar4 = std::max<double>(&local_20,(double *)(local_1b8 + 0x178));
        local_20 = *pdVar4;
      }
    }
  }
  if ((local_18[0] == INFINITY) && (!NAN(local_18[0]))) {
    local_18[0] = 0.0;
  }
  std::__cxx11::stringstream::stringstream(local_1c8);
  std::__cxx11::string::string(local_1e8);
  std::__cxx11::stringstream::str((string *)local_1c8);
  std::__cxx11::string::~string(local_1e8);
  Textline<char[14]>((char (*) [14])in_stack_fffffffffffffbc8);
  poVar5 = std::operator<<((ostream *)local_1b8,local_218);
  poVar5 = std::operator<<(poVar5,"[");
  Scientific_abi_cxx11_
            (in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
             (int)in_stack_fffffffffffffa30);
  poVar5 = std::operator<<(poVar5,local_238);
  poVar5 = std::operator<<(poVar5,", ");
  Scientific_abi_cxx11_
            (in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
             (int)in_stack_fffffffffffffa30);
  poVar5 = std::operator<<(poVar5,local_258);
  std::operator<<(poVar5,"]\n");
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_218);
  Control::hLog(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  local_260 = INFINITY;
  local_268 = 0.0;
  local_270 = (double *)(in_RDI + 0x1d8);
  local_278 = std::begin<double>((valarray<double> *)in_stack_fffffffffffffa30);
  pdVar4 = local_270;
  local_280 = std::end<double>(in_stack_fffffffffffffa28);
  for (; local_278 != local_280; local_278 = local_278 + 1) {
    local_288 = *local_278;
    if ((local_288 != 0.0) || (NAN(local_288))) {
      std::abs((int)pdVar4);
      pdVar4 = &local_260;
      pdVar3 = std::min<double>(pdVar4,&local_290);
      local_260 = *pdVar3;
      std::abs((int)pdVar4);
      pdVar4 = &local_268;
      pdVar3 = std::max<double>(pdVar4,&local_298);
      local_268 = *pdVar3;
    }
  }
  if ((local_260 == INFINITY) && (!NAN(local_260))) {
    local_260 = 0.0;
  }
  this_00 = (Control *)local_1b8;
  Textline<char[11]>((char (*) [11])in_stack_fffffffffffffbc8);
  logging = (stringstream *)std::operator<<((ostream *)this_00,local_2b8);
  poVar5 = std::operator<<((ostream *)logging,"[");
  Scientific_abi_cxx11_
            (in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
             (int)in_stack_fffffffffffffa30);
  poVar5 = std::operator<<(poVar5,local_2d8);
  poVar5 = std::operator<<(poVar5,", ");
  Scientific_abi_cxx11_
            (in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
             (int)in_stack_fffffffffffffa30);
  poVar5 = std::operator<<(poVar5,local_2f8);
  std::operator<<(poVar5,"]\n");
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_2b8);
  Control::hLog(this_00,logging);
  local_300 = INFINITY;
  local_308 = 0.0;
  local_310 = (double *)(in_RDI + 0x1c8);
  local_318 = std::begin<double>((valarray<double> *)in_stack_fffffffffffffa30);
  pdVar4 = local_310;
  local_320 = std::end<double>(in_stack_fffffffffffffa28);
  for (; local_318 != local_320; local_318 = local_318 + 1) {
    local_328 = *local_318;
    if ((local_328 != 0.0) || (NAN(local_328))) {
      std::abs((int)pdVar4);
      pdVar4 = &local_300;
      pdVar3 = std::min<double>(pdVar4,&local_330);
      local_300 = *pdVar3;
      std::abs((int)pdVar4);
      pdVar4 = &local_308;
      pdVar3 = std::max<double>(pdVar4,&local_338);
      local_308 = *pdVar3;
    }
  }
  if ((local_300 == INFINITY) && (!NAN(local_300))) {
    local_300 = 0.0;
  }
  Textline<char[17]>(in_stack_fffffffffffffbc8);
  poVar5 = std::operator<<((ostream *)local_1b8,local_358);
  poVar5 = std::operator<<(poVar5,"[");
  Scientific_abi_cxx11_
            (in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
             (int)in_stack_fffffffffffffa30);
  poVar5 = std::operator<<(poVar5,local_378);
  poVar5 = std::operator<<(poVar5,", ");
  Scientific_abi_cxx11_
            (in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
             (int)in_stack_fffffffffffffa30);
  poVar5 = std::operator<<(poVar5,local_398);
  std::operator<<(poVar5,"]\n");
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_358);
  Control::hLog(this_00,logging);
  local_3a0 = INFINITY;
  local_3a8 = 0.0;
  local_3b0 = (double *)(in_RDI + 0x1e8);
  local_3b8 = std::begin<double>((valarray<double> *)in_stack_fffffffffffffa30);
  pdVar4 = local_3b0;
  local_3c0 = std::end<double>(in_stack_fffffffffffffa28);
  for (; local_3b8 != local_3c0; local_3b8 = local_3b8 + 1) {
    local_3c8 = *local_3b8;
    if (((local_3c8 != 0.0) || (NAN(local_3c8))) && (bVar1 = std::isfinite(local_3c8), bVar1)) {
      std::abs((int)pdVar4);
      pdVar4 = &local_3a0;
      pdVar3 = std::min<double>(pdVar4,&local_3d0);
      local_3a0 = *pdVar3;
      std::abs((int)pdVar4);
      pdVar4 = &local_3a8;
      pdVar3 = std::max<double>(pdVar4,&local_3d8);
      local_3a8 = *pdVar3;
    }
  }
  local_3e0 = (double *)(in_RDI + 0x1f8);
  local_3e8 = std::begin<double>((valarray<double> *)in_stack_fffffffffffffa30);
  pdVar4 = local_3e0;
  local_3f0 = std::end<double>(in_stack_fffffffffffffa28);
  for (; local_3e8 != local_3f0; local_3e8 = local_3e8 + 1) {
    local_3f8 = *local_3e8;
    if (((local_3f8 != 0.0) || (NAN(local_3f8))) && (bVar1 = std::isfinite(local_3f8), bVar1)) {
      std::abs((int)pdVar4);
      pdVar4 = &local_3a0;
      pdVar3 = std::min<double>(pdVar4,&local_400);
      local_3a0 = *pdVar3;
      std::abs((int)pdVar4);
      pdVar4 = &local_3a8;
      pdVar3 = std::max<double>(pdVar4,&local_408);
      local_3a8 = *pdVar3;
    }
  }
  if ((local_3a0 == INFINITY) && (!NAN(local_3a0))) {
    local_3a0 = 0.0;
  }
  Textline<char[14]>((char (*) [14])in_stack_fffffffffffffbc8);
  poVar5 = std::operator<<((ostream *)local_1b8,local_428);
  poVar5 = std::operator<<(poVar5,"[");
  Scientific_abi_cxx11_
            (in_stack_fffffffffffffa38,(int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
             (int)in_stack_fffffffffffffa30);
  poVar5 = std::operator<<(poVar5,local_448);
  poVar6 = std::operator<<(poVar5,", ");
  Scientific_abi_cxx11_((double)poVar5,(int)((ulong)poVar6 >> 0x20),(int)poVar6);
  poVar5 = std::operator<<(poVar6,local_468);
  std::operator<<(poVar5,"]\n");
  std::__cxx11::string::~string(local_468);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_428);
  Control::hLog(this_00,logging);
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return;
}

Assistant:

void Model::PrintCoefficientRange(const Control& control) const {
    double amin = INFINITY;
    double amax = 0.0;
    for (Int j = 0; j < A_.cols(); j++) {
        for (Int p = A_.begin(j); p < A_.end(j); p++) {
            double x = A_.value(p);
            if (x != 0.0) {
                amin = std::min(amin, std::abs(x));
                amax = std::max(amax, std::abs(x));
            }
        }
    }
    if (amin == INFINITY)       // no nonzero entries in A_
        amin = 0.0;
    std::stringstream h_logging_stream;
    h_logging_stream.str(std::string());
    h_logging_stream
      << Textline("Matrix range:")
      << "[" << Scientific(amin, 5, 0) << ", "
      << Scientific(amax, 5, 0) << "]\n";
    control.hLog(h_logging_stream);

    double rhsmin = INFINITY;
    double rhsmax = 0.0;
    for (double x : scaled_rhs_) {
        if (x != 0.0) {
            rhsmin = std::min(rhsmin, std::abs(x));
            rhsmax = std::max(rhsmax, std::abs(x));
        }
    }
    if (rhsmin == INFINITY)     // no nonzero entries in rhs
        rhsmin = 0.0;
    h_logging_stream
      << Textline("RHS range:")
      << "[" << Scientific(rhsmin, 5, 0) << ", "
      << Scientific(rhsmax, 5, 0) << "]\n";
    control.hLog(h_logging_stream);

    double objmin = INFINITY;
    double objmax = 0.0;
    for (double x : scaled_obj_) {
        if (x != 0.0) {
            objmin = std::min(objmin, std::abs(x));
            objmax = std::max(objmax, std::abs(x));
        }
    }
    if (objmin == INFINITY)     // no nonzero entries in obj
        objmin = 0.0;
    h_logging_stream
      << Textline("Objective range:")
      << "[" << Scientific(objmin, 5, 0) << ", "
      << Scientific(objmax, 5, 0) << "]\n";
    control.hLog(h_logging_stream);

    double boundmin = INFINITY;
    double boundmax = 0.0;
    for (double x : scaled_lbuser_) {
        if (x != 0.0 && std::isfinite(x)) {
            boundmin = std::min(boundmin, std::abs(x));
            boundmax = std::max(boundmax, std::abs(x));
        }
    }
    for (double x : scaled_ubuser_) {
        if (x != 0.0 && std::isfinite(x)) {
            boundmin = std::min(boundmin, std::abs(x));
            boundmax = std::max(boundmax, std::abs(x));
        }
    }
    if (boundmin == INFINITY)   // no finite nonzeros entries in bounds
        boundmin = 0.0;
    h_logging_stream
      << Textline("Bounds range:")
      << "[" << Scientific(boundmin, 5, 0) << ", "
      << Scientific(boundmax, 5, 0) << "]\n";
    control.hLog(h_logging_stream);
}